

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void closeCursorsInFrame(Vdbe *p)

{
  VdbeCursor *pC;
  int i;
  Vdbe *p_local;
  
  for (pC._4_4_ = 0; pC._4_4_ < p->nCursor; pC._4_4_ = pC._4_4_ + 1) {
    if (p->apCsr[pC._4_4_] != (VdbeCursor *)0x0) {
      sqlite3VdbeFreeCursorNN(p,p->apCsr[pC._4_4_]);
      p->apCsr[pC._4_4_] = (VdbeCursor *)0x0;
    }
  }
  return;
}

Assistant:

static void closeCursorsInFrame(Vdbe *p){
  int i;
  for(i=0; i<p->nCursor; i++){
    VdbeCursor *pC = p->apCsr[i];
    if( pC ){
      sqlite3VdbeFreeCursorNN(p, pC);
      p->apCsr[i] = 0;
    }
  }
}